

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  bool bVar1;
  Message *pMVar2;
  String *extraout_RDX;
  AssertionResult AVar4;
  char *local_68 [3];
  Message local_50;
  char *local_48;
  char *begin_string_quote;
  char **ppcStack_38;
  bool is_wide_string;
  char **haystack_local;
  char **needle_local;
  char *haystack_expr_local;
  char *needle_expr_local;
  _anonymous_namespace_ *p_Stack_10;
  bool expected_to_be_substring_local;
  scoped_ptr<testing::internal::String> sVar3;
  
  ppcStack_38 = haystack;
  haystack_local = needle;
  needle_local = (char **)haystack_expr;
  haystack_expr_local = needle_expr;
  needle_expr_local._7_1_ = expected_to_be_substring;
  p_Stack_10 = this;
  bVar1 = anon_unknown_18::IsSubstringPred(*needle,*haystack);
  if (bVar1 == (bool)(needle_expr_local._7_1_ & 1)) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    begin_string_quote._7_1_ = 0;
    local_48 = "\"";
    Message::Message(&local_50);
    pMVar2 = Message::operator<<(&local_50,(char (*) [11])"Value of: ");
    pMVar2 = Message::operator<<(pMVar2,&haystack_expr_local);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x2073e8);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x206d4b);
    pMVar2 = Message::operator<<(pMVar2,&local_48);
    pMVar2 = Message::operator<<(pMVar2,haystack_local);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x2074c9);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x206d57);
    local_68[0] = "not ";
    if ((needle_expr_local._7_1_ & 1) != 0) {
      local_68[0] = "";
    }
    pMVar2 = Message::operator<<(pMVar2,local_68);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [16])"a substring of ");
    pMVar2 = Message::operator<<(pMVar2,(char **)&needle_local);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x2073e8);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x206d74);
    pMVar2 = Message::operator<<(pMVar2,&local_48);
    pMVar2 = Message::operator<<(pMVar2,ppcStack_38);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x206dff);
    AssertionFailure((testing *)this,pMVar2);
    Message::~Message(&local_50);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure(
      Message()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"");
}